

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# at_application.h
# Opt level: O2

void __thiscall MessageCracker::MessageCracker(MessageCracker *this)

{
  _Rb_tree_header *p_Var1;
  
  FIX::MessageCracker::MessageCracker(&this->super_MessageCracker);
  (this->super_MessageCracker).super_MessageCracker._vptr_MessageCracker =
       (_func_int **)&PTR__MessageCracker_00163a28;
  (this->super_MessageCracker).super_MessageCracker._vptr_MessageCracker =
       (_func_int **)&PTR__MessageCracker_00163c70;
  (this->super_MessageCracker).super_MessageCracker._vptr_MessageCracker =
       (_func_int **)&PTR__MessageCracker_00163e60;
  (this->super_MessageCracker).super_MessageCracker._vptr_MessageCracker =
       (_func_int **)&PTR__MessageCracker_00164170;
  (this->super_MessageCracker).super_MessageCracker._vptr_MessageCracker =
       (_func_int **)&PTR__MessageCracker_001645e0;
  (this->super_MessageCracker).super_MessageCracker._vptr_MessageCracker =
       (_func_int **)&PTR__MessageCracker_00164be0;
  (this->super_MessageCracker).super_MessageCracker._vptr_MessageCracker =
       (_func_int **)&PTR__MessageCracker_001651e0;
  (this->super_MessageCracker).super_MessageCracker._vptr_MessageCracker =
       (_func_int **)&PTR__MessageCracker_001658a0;
  (this->super_MessageCracker).super_MessageCracker._vptr_MessageCracker =
       (_func_int **)&PTR__MessageCracker_00165f90;
  p_Var1 = &(this->m_orderIDs)._M_t._M_impl.super__Rb_tree_header;
  (this->m_orderIDs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_orderIDs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_orderIDs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_orderIDs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_orderIDs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

void process( const FIX::Message& message, const FIX::SessionID& sessionID )
  {
    FIX::Message echo = message;
    FIX::PossResend possResend( false );
    message.getHeader().getFieldIfSet( possResend );

    FIX::ClOrdID clOrdID;
    message.getField( clOrdID );

    std::pair < FIX::ClOrdID, FIX::SessionID > pair =
      std::make_pair( clOrdID, sessionID );

    if ( possResend == true )
    {
      if ( m_orderIDs.find( pair ) != m_orderIDs.end() )
        return ;
    }
    m_orderIDs.insert( pair );
    FIX::Session::sendToTarget( echo, sessionID );
  }